

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

JavascriptMethod __thiscall
Js::FunctionBody::EnsureDynamicInterpreterThunk
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  JobProcessor *this_00;
  char *message;
  char *error;
  uint lineNumber;
  FunctionInfo *pFVar7;
  
  EnsureDynamicProfileInfo(this);
  bVar2 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf21,"(HasValidEntryPoint())","HasValidEntryPoint()");
    if (!bVar2) goto LAB_0076674c;
    *puVar5 = 0;
  }
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0) {
    uVar3 = GetCountField(this,ByteCodeCount);
    if (uVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf22,"(!m_isWasmFunction || GetByteCodeCount() > 0)",
                                  "Wasm function should be parsed by this point");
      if (!bVar2) goto LAB_0076674c;
      *puVar5 = 0;
    }
  }
  bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk
                    ((JavascriptMethod)
                     (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod);
  if (bVar2) {
    pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_0076674c;
      *puVar5 = 0;
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) goto LAB_0076674c;
      *puVar5 = 0;
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar7);
    bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf26,
                                  "(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))"
                                  ,
                                  "InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked())"
                                 );
      if (!bVar2) goto LAB_0076674c;
      *puVar5 = 0;
    }
    GenerateDynamicInterpreterThunk(this);
    pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_0076674c;
      *puVar5 = 0;
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) goto LAB_0076674c;
      *puVar5 = 0;
      pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar7);
    (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)p_Var6;
  }
  else {
    pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if ((entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod ==
        ScriptContext::DebugProfileProbeThunk) {
      if (pFVar7 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_0076674c;
        *puVar5 = 0;
        pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar2) goto LAB_0076674c;
        *puVar5 = 0;
        pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar7);
      bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        error = 
        "(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))"
        ;
        message = 
        "InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked())"
        ;
        lineNumber = 0xf2e;
LAB_007665f6:
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,lineNumber,error,message);
        if (!bVar2) goto LAB_0076674c;
        *puVar5 = 0;
      }
LAB_00766632:
      GenerateDynamicInterpreterThunk(this);
    }
    else {
      if (pFVar7 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_0076674c;
        *puVar5 = 0;
        pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar2) goto LAB_0076674c;
        *puVar5 = 0;
        pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar7);
      bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
      if (bVar2) {
        this_00 = ThreadContext::GetJobProcessor
                            (((this->super_ParseableFunctionInfo).super_FunctionProxy.
                             m_scriptContext)->threadContext);
        bVar2 = JsUtil::JobProcessor::ProcessesInBackground(this_00);
        if (!bVar2) {
          BVar4 = IsIntermediateCodeGenThunk
                            ((JavascriptMethod)
                             ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                              m_defaultEntryPointInfo.ptr)->jsMethod);
          if (BVar4 == 0) {
            BVar4 = IsAsmJsCodeGenThunk((JavascriptMethod)
                                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                         m_defaultEntryPointInfo.ptr)->jsMethod);
            if (BVar4 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar5 = 1;
              error = 
              "(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())))"
              ;
              message = 
              "IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo()))"
              ;
              lineNumber = 0xf45;
              goto LAB_007665f6;
            }
          }
          goto LAB_00766632;
        }
        CCLock::Enter((CCLock *)(this_00 + 1));
        pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar7 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_0076674c;
          *puVar5 = 0;
          pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                      "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar2) goto LAB_0076674c;
          *puVar5 = 0;
          pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar7);
        bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
        if (bVar2) {
          BVar4 = IsIntermediateCodeGenThunk
                            ((JavascriptMethod)
                             ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                              m_defaultEntryPointInfo.ptr)->jsMethod);
          if (BVar4 == 0) {
            BVar4 = IsAsmJsCodeGenThunk((JavascriptMethod)
                                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                         m_defaultEntryPointInfo.ptr)->jsMethod);
            if (BVar4 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                          ,0xf3d,
                                          "(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())))"
                                          ,
                                          "IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo()))"
                                         );
              if (!bVar2) goto LAB_0076674c;
              *puVar5 = 0;
            }
          }
          GenerateDynamicInterpreterThunk(this);
        }
        CCLock::Leave((CCLock *)(this_00 + 1));
      }
    }
  }
  pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0076674c;
    *puVar5 = 0;
    pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar7->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_0076674c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    pFVar7 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(pFVar7);
  return p_Var6;
}

Assistant:

JavascriptMethod FunctionBody::EnsureDynamicInterpreterThunk(FunctionEntryPointInfo* entryPointInfo)
    {
        // This may be first call to the function, make sure we have dynamic profile info
        //
        // We need to ensure dynamic profile info even if we didn't generate a dynamic interpreter thunk
        // This happens when we go through CheckCodeGen thunk, to DelayDynamicInterpreterThunk, to here
        // but the background codegen thread updated the entry point with the native entry point.
        this->EnsureDynamicProfileInfo();

        Assert(HasValidEntryPoint());
        AssertMsg(!m_isWasmFunction || GetByteCodeCount() > 0, "Wasm function should be parsed by this point");
        if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetEntryPoint(entryPointInfo)))
        {
            // We are not doing code gen on this function, just change the entry point directly
            Assert(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()));
            GenerateDynamicInterpreterThunk();
            this->SetEntryPoint(entryPointInfo, this->GetOriginalEntryPoint_Unchecked());
        }
        else if (this->GetEntryPoint(entryPointInfo) == ProfileEntryThunk)
        {
            // We are not doing codegen on this function, just change the entry point directly
            // Don't replace the profile entry thunk
            Assert(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()));
            GenerateDynamicInterpreterThunk();
        }
        else if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))
        {
            JsUtil::JobProcessor * jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
            if (jobProcessor->ProcessesInBackground())
            {
                JsUtil::BackgroundJobProcessor * backgroundJobProcessor = static_cast<JsUtil::BackgroundJobProcessor *>(jobProcessor);
                AutoCriticalSection autocs(backgroundJobProcessor->GetCriticalSection());
                // Check again under lock
                if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))
                {
                    // If the original entry point is DelayDynamicInterpreterThunk then there must be a version of this
                    // function being codegen'd.
                    Assert(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())));
                    GenerateDynamicInterpreterThunk();
                }
            }
            else
            {
                // If the original entry point is DelayDynamicInterpreterThunk then there must be a version of this
                // function being codegen'd.
                Assert(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())));
                GenerateDynamicInterpreterThunk();
            }
        }
        return this->GetOriginalEntryPoint_Unchecked();
    }